

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PackageExportAllDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageExportAllDeclarationSyntax,slang::syntax::PackageExportAllDeclarationSyntax_const&>
          (BumpAllocator *this,PackageExportAllDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  PackageExportAllDeclarationSyntax *pPVar7;
  long lVar8;
  Token *pTVar9;
  Token *pTVar10;
  byte bVar11;
  
  bVar11 = 0;
  pPVar7 = (PackageExportAllDeclarationSyntax *)allocate(this,0xa0,8);
  uVar3 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pPVar7->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pPVar7->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pPVar7->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  (pPVar7->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pPVar7->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pPVar7->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pPVar7->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pPVar7->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pPVar7->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00596408;
  (pPVar7->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pPVar7->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pPVar7->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pPVar7->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005968d0;
  pTVar9 = &args->keyword;
  pTVar10 = &pPVar7->keyword;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar4 = pTVar9->field_0x2;
    NVar5.raw = (pTVar9->numFlags).raw;
    uVar6 = pTVar9->rawLen;
    pTVar10->kind = pTVar9->kind;
    pTVar10->field_0x2 = uVar4;
    pTVar10->numFlags = (NumericTokenFlags)NVar5.raw;
    pTVar10->rawLen = uVar6;
    pTVar9 = (Token *)&pTVar9[-(ulong)bVar11].info;
    pTVar10 = (Token *)&pTVar10[-(ulong)bVar11].info;
  }
  return pPVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }